

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O2

bool anon_unknown.dwarf_5e3f9f::extract_tar
               (string *outFileName,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *files,bool verbose,bool extract)

{
  pointer pbVar1;
  FILE *__stream;
  archive_entry *entry_00;
  bool bVar2;
  wchar_t wVar3;
  uint uVar4;
  mode_t mVar5;
  int iVar6;
  wchar_t wVar7;
  archive *a;
  archive *_a;
  archive *paVar8;
  char *pcVar9;
  string *__s;
  la_int64_t lVar10;
  size_t sVar11;
  dev_t dVar12;
  dev_t dVar13;
  size_t sVar14;
  tm *__tp;
  la_ssize_t r;
  char *extraout_RDX;
  char *extraout_RDX_00;
  char *__format;
  pointer __rhs;
  allocator<char> local_119;
  archive_entry *entry;
  archive *local_110;
  size_t size;
  char tmp [100];
  char *p;
  time_t tim;
  cmLocaleRAII localeRAII;
  
  cmLocaleRAII::cmLocaleRAII(&localeRAII);
  a = archive_read_new();
  _a = archive_write_disk_new();
  archive_read_support_filter_all(a);
  archive_read_support_format_all(a);
  paVar8 = archive_match_new();
  if (paVar8 == (archive *)0x0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)tmp,"Out of memory",(allocator<char> *)&size);
    cmSystemTools::Error((string *)tmp);
LAB_0021775c:
    std::__cxx11::string::~string((string *)tmp);
  }
  else {
    pbVar1 = (files->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    pcVar9 = extraout_RDX;
    local_110 = paVar8;
    for (__rhs = (files->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start; __rhs != pbVar1; __rhs = __rhs + 1) {
      wVar3 = archive_match_include_pattern(local_110,(__rhs->_M_dataplus)._M_p);
      if (wVar3 != L'\0') {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)tmp,
                       "Failed to add to inclusion list: ",__rhs);
        cmSystemTools::Error((string *)tmp);
        goto LAB_0021775c;
      }
      pcVar9 = extraout_RDX_00;
    }
    cmsys::Encoding::ToWide_abi_cxx11_
              ((wstring *)tmp,(Encoding *)(outFileName->_M_dataplus)._M_p,pcVar9);
    wVar3 = archive_read_open_filename_w(a,(wchar_t *)tmp._0_8_,0x2800);
    std::__cxx11::wstring::~wstring((wstring *)tmp);
    if (wVar3 == L'\0') {
LAB_0021778e:
      do {
        do {
          wVar3 = archive_read_next_header(a,&entry);
          if (wVar3 != L'\0') {
            if (wVar3 != L'\x01') {
              ArchiveError("Problem with archive_read_next_header(): ",a);
            }
            goto LAB_00217bf0;
          }
          wVar3 = archive_match_excluded(local_110,entry);
          entry_00 = entry;
          __stream = _stdout;
        } while (wVar3 != L'\0');
        if (verbose) {
          if (extract) {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)tmp,"x ",(allocator<char> *)&size);
            cmSystemTools::Stdout((string *)tmp);
            std::__cxx11::string::~string((string *)tmp);
            cm_archive_entry_pathname_abi_cxx11_((string *)tmp,entry);
            cmSystemTools::Stdout((string *)tmp);
            std::__cxx11::string::~string((string *)tmp);
          }
          else {
            if ((anonymous_namespace)::list_item_verbose(_IO_FILE*,archive_entry*)::now == 0) {
              time(&(anonymous_namespace)::list_item_verbose(_IO_FILE*,archive_entry*)::now);
            }
            pcVar9 = archive_entry_strmode((archive_entry_conflict *)entry_00);
            uVar4 = archive_entry_nlink(entry_00);
            fprintf(__stream,"%s %d ",pcVar9,(ulong)uVar4);
            __s = (string *)archive_entry_uname(entry_00);
            if ((__s == (string *)0x0) || (*(char *)&(__s->_M_dataplus)._M_p == '\0')) {
              lVar10 = archive_entry_uid(entry_00);
              sprintf(tmp,"%lu ",lVar10);
              __s = (string *)tmp;
            }
            sVar11 = strlen((char *)__s);
            if (sVar11 < 7) {
              sVar11 = 6;
            }
            fprintf(__stream,"%-*s ",sVar11 & 0xffffffff,__s);
            pcVar9 = archive_entry_gname(entry_00);
            if ((pcVar9 == (char *)0x0) || (*pcVar9 == '\0')) {
              lVar10 = archive_entry_gid(entry_00);
              sprintf(tmp,"%lu",lVar10);
              sVar11 = strlen(tmp);
              fputs(tmp,__stream);
            }
            else {
              fputs(pcVar9,__stream);
              sVar11 = strlen(pcVar9);
            }
            mVar5 = archive_entry_filetype(entry_00);
            if ((mVar5 == 0x2000) || (mVar5 = archive_entry_filetype(entry_00), mVar5 == 0x6000)) {
              dVar12 = archive_entry_rdevmajor(entry_00);
              dVar13 = archive_entry_rdevminor(entry_00);
              sprintf(tmp,"%lu,%lu",dVar12,dVar13);
            }
            else {
              lVar10 = archive_entry_size(entry_00);
              sprintf(tmp,"%lu",lVar10);
            }
            sVar14 = strlen(tmp);
            iVar6 = (int)(sVar14 + sVar11) + 1;
            if (sVar14 + sVar11 < 0xd) {
              iVar6 = 0xd;
            }
            fprintf(__stream,"%*s",(ulong)(uint)(iVar6 - (int)sVar11),(string *)tmp);
            tim = archive_entry_mtime(entry_00);
            pcVar9 = "%e %b %H:%M";
            if ((anonymous_namespace)::list_item_verbose(_IO_FILE*,archive_entry*)::now + 0xf099c0 <
                tim) {
              pcVar9 = "%e %b  %Y";
            }
            if (tim < (anonymous_namespace)::list_item_verbose(_IO_FILE*,archive_entry*)::now +
                      -0xf099c0) {
              pcVar9 = "%e %b  %Y";
            }
            __tp = localtime(&tim);
            strftime(tmp,100,pcVar9,__tp);
            fprintf(__stream," %s ",(string *)tmp);
            cm_archive_entry_pathname_abi_cxx11_((string *)&size,entry_00);
            fputs((char *)size,__stream);
            std::__cxx11::string::~string((string *)&size);
            pcVar9 = archive_entry_hardlink(entry_00);
            if (pcVar9 == (char *)0x0) {
              pcVar9 = archive_entry_symlink(entry_00);
              if (pcVar9 != (char *)0x0) {
                pcVar9 = archive_entry_symlink(entry_00);
                __format = " -> %s";
                goto LAB_00217ade;
              }
            }
            else {
              pcVar9 = archive_entry_hardlink(entry_00);
              __format = " link to %s";
LAB_00217ade:
              fprintf(__stream,__format,pcVar9);
            }
            fflush(__stream);
          }
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)tmp,"\n",(allocator<char> *)&size);
          cmSystemTools::Stdout((string *)tmp);
          std::__cxx11::string::~string((string *)tmp);
          if (!extract) goto LAB_0021778e;
        }
        else if (!extract) {
          cm_archive_entry_pathname_abi_cxx11_((string *)tmp,entry);
          cmSystemTools::Stdout((string *)tmp);
          std::__cxx11::string::~string((string *)tmp);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)tmp,"\n",(allocator<char> *)&size);
          cmSystemTools::Stdout((string *)tmp);
          std::__cxx11::string::~string((string *)tmp);
          goto LAB_0021778e;
        }
        wVar3 = archive_write_disk_set_options(_a,L'\x04');
        if (wVar3 != L'\0') {
          ArchiveError("Problem with archive_write_disk_set_options(): ",_a);
          goto LAB_00217bf0;
        }
        wVar3 = archive_write_header(_a,entry);
        if (wVar3 != L'\0') {
          ArchiveError("Problem with archive_write_header(): ",_a);
          cm_archive_entry_pathname_abi_cxx11_((string *)&size,entry);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)tmp,
                         "Current file: ",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&size)
          ;
          cmSystemTools::Error((string *)tmp);
          std::__cxx11::string::~string((string *)tmp);
          std::__cxx11::string::~string((string *)&size);
          goto LAB_00217bf0;
        }
LAB_00217b55:
        iVar6 = archive_read_data_block(a,(void **)tmp,&size,&tim);
        if (iVar6 != 1) {
          bVar2 = la_diagnostic(a,(long)iVar6);
          if (bVar2) goto code_r0x00217b80;
          goto LAB_00217bd6;
        }
        wVar3 = archive_write_finish_entry(_a);
      } while (wVar3 == L'\0');
      ArchiveError("Problem with archive_write_finish_entry(): ",_a);
LAB_00217bf0:
      bVar2 = false;
      while (wVar7 = archive_match_path_unmatched_inclusions_next(local_110,&p), wVar7 == L'\0') {
        std::__cxx11::string::string<std::allocator<char>>((string *)&tim,p,&local_119);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&size,
                       "tar: ",(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &tim);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)tmp,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&size,
                       ": Not found in archive");
        cmSystemTools::Error
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)tmp);
        std::__cxx11::string::~string((string *)tmp);
        std::__cxx11::string::~string((string *)&size);
        std::__cxx11::string::~string((string *)&tim);
        bVar2 = true;
      }
      if (!bVar2) {
        if (wVar7 != L'\xffffffe2') {
          archive_match_free(local_110);
          archive_write_free(_a);
          archive_read_close(a);
          archive_read_free(a);
          bVar2 = (uint)wVar3 < 2;
          goto LAB_00217768;
        }
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)tmp,"tar: Out of memory",(allocator<char> *)&size);
        cmSystemTools::Error((string *)tmp);
        goto LAB_0021775c;
      }
    }
    else {
      ArchiveError("Problem with archive_read_open_file(): ",a);
      archive_write_free(_a);
      archive_read_close(a);
    }
  }
  bVar2 = false;
LAB_00217768:
  cmLocaleRAII::~cmLocaleRAII(&localeRAII);
  return bVar2;
code_r0x00217b80:
  r = archive_write_data_block(_a,(void *)tmp._0_8_,size,tim);
  bVar2 = la_diagnostic(a,r);
  if (!bVar2) {
LAB_00217bd6:
    wVar3 = L'\0';
    goto LAB_00217bf0;
  }
  goto LAB_00217b55;
}

Assistant:

bool extract_tar(const std::string& outFileName,
                 const std::vector<std::string>& files, bool verbose,
                 bool extract)
{
  cmLocaleRAII localeRAII;
  static_cast<void>(localeRAII);
  struct archive* a = archive_read_new();
  struct archive* ext = archive_write_disk_new();
  archive_read_support_filter_all(a);
  archive_read_support_format_all(a);
  struct archive_entry* entry;

  struct archive* matching = archive_match_new();
  if (matching == nullptr) {
    cmSystemTools::Error("Out of memory");
    return false;
  }

  for (const auto& filename : files) {
    if (archive_match_include_pattern(matching, filename.c_str()) !=
        ARCHIVE_OK) {
      cmSystemTools::Error("Failed to add to inclusion list: " + filename);
      return false;
    }
  }

  int r = cm_archive_read_open_file(a, outFileName.c_str(), 10240);
  if (r) {
    ArchiveError("Problem with archive_read_open_file(): ", a);
    archive_write_free(ext);
    archive_read_close(a);
    return false;
  }
  for (;;) {
    r = archive_read_next_header(a, &entry);
    if (r == ARCHIVE_EOF) {
      break;
    }
    if (r != ARCHIVE_OK) {
      ArchiveError("Problem with archive_read_next_header(): ", a);
      break;
    }

    if (archive_match_excluded(matching, entry)) {
      continue;
    }

    if (verbose) {
      if (extract) {
        cmSystemTools::Stdout("x ");
        cmSystemTools::Stdout(cm_archive_entry_pathname(entry));
      } else {
        list_item_verbose(stdout, entry);
      }
      cmSystemTools::Stdout("\n");
    } else if (!extract) {
      cmSystemTools::Stdout(cm_archive_entry_pathname(entry));
      cmSystemTools::Stdout("\n");
    }
    if (extract) {
      r = archive_write_disk_set_options(ext, ARCHIVE_EXTRACT_TIME);
      if (r != ARCHIVE_OK) {
        ArchiveError("Problem with archive_write_disk_set_options(): ", ext);
        break;
      }

      r = archive_write_header(ext, entry);
      if (r == ARCHIVE_OK) {
        if (!copy_data(a, ext)) {
          break;
        }
        r = archive_write_finish_entry(ext);
        if (r != ARCHIVE_OK) {
          ArchiveError("Problem with archive_write_finish_entry(): ", ext);
          break;
        }
      }
#  ifdef _WIN32
      else if (const char* linktext = archive_entry_symlink(entry)) {
        std::cerr << "cmake -E tar: warning: skipping symbolic link \""
                  << cm_archive_entry_pathname(entry) << "\" -> \"" << linktext
                  << "\"." << std::endl;
      }
#  endif
      else {
        ArchiveError("Problem with archive_write_header(): ", ext);
        cmSystemTools::Error("Current file: " +
                             cm_archive_entry_pathname(entry));
        break;
      }
    }
  }